

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# central_freelist.cc
# Opt level: O1

void __thiscall
tcmalloc::CentralFreeList::InsertRange(CentralFreeList *this,void *start,void *end,int N)

{
  int iVar1;
  undefined8 *puVar2;
  bool bVar3;
  SpinLockHolder local_30;
  SpinLockHolder h;
  
  LOCK();
  bVar3 = (this->lock_).lockword_.super___atomic_base<int>._M_i == 0;
  if (bVar3) {
    (this->lock_).lockword_.super___atomic_base<int>._M_i = 1;
  }
  UNLOCK();
  local_30.lock_ = &this->lock_;
  if (!bVar3) {
    SpinLock::SlowLock(&this->lock_);
  }
  if ((*(int *)(&DAT_00144c84 + (ulong)(uint)this->size_class_ * 4) == N) &&
     (bVar3 = MakeCacheSpace(this), bVar3)) {
    iVar1 = this->used_slots_;
    this->used_slots_ = iVar1 + 1;
    this->tc_slots_[iVar1].head = start;
    this->tc_slots_[iVar1].tail = end;
  }
  else {
    while ((undefined8 *)start != (undefined8 *)0x0) {
      puVar2 = *start;
      ReleaseToSpans(this,start);
      start = puVar2;
    }
  }
  SpinLockHolder::~SpinLockHolder(&local_30);
  return;
}

Assistant:

void CentralFreeList::InsertRange(void *start, void *end, int N) {
  SpinLockHolder h(&lock_);
  if (N == Static::sizemap()->num_objects_to_move(size_class_) &&
    MakeCacheSpace()) {
    int slot = used_slots_++;
    ASSERT(slot >=0);
    ASSERT(slot < max_cache_size_);
    TCEntry *entry = &tc_slots_[slot];
    entry->head = start;
    entry->tail = end;
    return;
  }
  ReleaseListToSpans(start);
}